

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

char fsnav_reschedule_plugin(_func_void *plugin,int cycle,int shift)

{
  fsnav_plugin *pfVar1;
  fsnav_struct *pfVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  bool bVar10;
  
  pfVar2 = fsnav;
  iVar3 = -cycle;
  if (0 < cycle) {
    iVar3 = cycle;
  }
  if (cycle == 0) {
    iVar5 = 0;
  }
  else {
    iVar7 = -cycle;
    if (0 < cycle) {
      iVar7 = cycle;
    }
    iVar5 = shift + iVar7;
    iVar6 = -iVar5;
    do {
      iVar5 = iVar5 - iVar7;
      iVar6 = iVar6 + iVar7;
    } while (iVar3 <= iVar5);
    iVar3 = 0;
    if (0 < iVar5) {
      iVar3 = iVar5;
    }
    iVar5 = (((iVar3 - (uint)(iVar3 != iVar5)) + iVar6) / (iVar7 + (uint)(iVar7 == 0)) +
            (uint)(iVar3 != iVar5)) * iVar7 + iVar5;
  }
  sVar8 = (fsnav->core).plugin_count;
  lVar9 = 0x10;
  cVar4 = '\0';
  while (bVar10 = sVar8 != 0, sVar8 = sVar8 - 1, bVar10) {
    pfVar1 = (pfVar2->core).plugins;
    if (*(_func_void **)((long)pfVar1 + lVar9 + -0x10) == plugin) {
      *(int *)((long)pfVar1 + lVar9 + -8) = cycle;
      *(int *)((long)pfVar1 + lVar9 + -4) = iVar5;
      *(undefined4 *)((long)&pfVar1->func + lVar9) = 0;
      cVar4 = '\x01';
    }
    lVar9 = lVar9 + 0x18;
  }
  return cVar4;
}

Assistant:

char fsnav_reschedule_plugin(void(*plugin)(void), int cycle, int shift)
{
	size_t i;
	int abs_cycle;
	char flag = 0;
	// shrink shift to [0..cycle-1]
	abs_cycle = abs(cycle);
	if (abs_cycle) {
		while (shift >= abs_cycle)
			shift -= abs_cycle;
		while (shift < 0)
			shift += abs_cycle;
	}
	else
		shift = 0;
	// go through execution list and set scheduling parameters, if found the plugin
	for (i = 0; i < fsnav->core.plugin_count; i++) {
		if (fsnav->core.plugins[i].func == plugin) {
			fsnav->core.plugins[i].cycle = cycle;
			fsnav->core.plugins[i].shift = shift;
			fsnav->core.plugins[i].tick  = 0;
			flag = 1;
		}
	}
	return flag;
}